

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrFrameEndInfo *value)

{
  pointer *this;
  XrCompositionLayerBaseHeader **ppXVar1;
  bool bVar2;
  XrResult XVar3;
  allocator local_9e1;
  string local_9e0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_9c0;
  allocator local_9a1;
  string local_9a0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_980;
  allocator local_961;
  string local_960 [32];
  __cxx11 local_940 [39];
  allocator local_919;
  string local_918 [8];
  string error_message_9;
  XrCompositionLayerPassthroughHTC **new_compositionlayerpassthroughhtc_value;
  allocator local_8d1;
  string local_8d0 [32];
  __cxx11 local_8b0 [39];
  allocator local_889;
  string local_888 [8];
  string error_message_8;
  XrCompositionLayerPassthroughFB **new_compositionlayerpassthroughfb_value;
  allocator local_841;
  string local_840 [32];
  __cxx11 local_820 [39];
  allocator local_7f9;
  string local_7f8 [8];
  string error_message_7;
  XrCompositionLayerEquirect2KHR **new_compositionlayerequirect2khr_value;
  allocator local_7b1;
  string local_7b0 [32];
  __cxx11 local_790 [39];
  allocator local_769;
  string local_768 [8];
  string error_message_6;
  XrCompositionLayerEquirectKHR **new_compositionlayerequirectkhr_value;
  allocator local_721;
  string local_720 [32];
  __cxx11 local_700 [39];
  allocator local_6d9;
  string local_6d8 [8];
  string error_message_5;
  XrCompositionLayerCylinderKHR **new_compositionlayercylinderkhr_value;
  allocator local_691;
  string local_690 [32];
  __cxx11 local_670 [39];
  allocator local_649;
  string local_648 [8];
  string error_message_4;
  XrCompositionLayerCubeKHR **new_compositionlayercubekhr_value;
  allocator local_601;
  string local_600 [32];
  __cxx11 local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [8];
  string error_message_3;
  XrCompositionLayerQuad **new_compositionlayerquad_value;
  allocator local_571;
  string local_570 [32];
  __cxx11 local_550 [39];
  allocator local_529;
  string local_528 [8];
  string error_message_2;
  XrCompositionLayerProjection **new_compositionlayerprojection_value;
  allocator local_4e1;
  string local_4e0 [32];
  __cxx11 local_4c0 [39];
  allocator local_499;
  string local_498 [8];
  string error_message_1;
  uint local_478;
  allocator local_471;
  uint32_t value_layers_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_450;
  allocator local_431;
  string local_430 [32];
  string local_410 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3f0;
  allocator local_3d1;
  string local_3d0 [32];
  string local_3b0 [32];
  ostringstream local_390 [8];
  ostringstream oss_enum;
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1a0;
  allocator local_181;
  string local_180 [32];
  undefined1 local_160 [40];
  string local_138 [8];
  string error_message;
  allocator local_111;
  string local_110 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f0;
  allocator local_d1;
  string local_d0 [36];
  NextChainResult local_ac;
  value_type local_a8;
  NextChainResult next_result;
  value_type local_a0 [5];
  value_type local_8c;
  undefined1 local_88 [8];
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrFrameEndInfo *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_FRAME_END_INFO) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrFrameEndInfo",value->type,
               "VUID-XrFrameEndInfo-type-type",XR_TYPE_FRAME_END_INFO,"XR_TYPE_FRAME_END_INFO");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = XR_TYPE_FRAME_END_INFO_ML;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,&local_8c);
    local_a0[0] = XR_TYPE_GLOBAL_DIMMER_FRAME_END_INFO_ML;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_a0);
    next_result = 0x3b9e15c0;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)&next_result);
    local_a8 = XR_TYPE_SECONDARY_VIEW_CONFIGURATION_FRAME_END_INFO_MSFT;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_a8);
    local_ac = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 &duplicate_ext_structs.
                                  super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)&encountered_structs.
                                              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_ac == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"VUID-XrFrameEndInfo-next-next",&local_d1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_f0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_110,
                 "Invalid structure(s) in \"next\" chain for XrFrameEndInfo struct \"next\"",
                 &local_111);
      CoreValidLogMessage(instance_info,(string *)local_d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_f0,(string *)local_110);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_f0);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_ac == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_138,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_160 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_160 + 0x27));
      std::__cxx11::string::operator+=(local_138,"XrFrameEndInfo : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_160,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_138,(string *)local_160);
      std::__cxx11::string::~string((string *)local_160);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,"VUID-XrFrameEndInfo-next-unique",&local_181);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1a0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1c0,
                 "Multiple structures of the same type(s) in \"next\" chain for XrFrameEndInfo struct"
                 ,&local_1c1);
      CoreValidLogMessage(instance_info,(string *)local_180,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_1a0,(string *)local_1c0);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_1a0);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_138);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"XrFrameEndInfo",&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"environmentBlendMode",&local_211);
    bVar2 = ValidateXrEnum(instance_info,command_name,(string *)local_1e8,(string *)local_210,
                           objects_info,value->environmentBlendMode);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      if ((value->layerCount == 0) || (value->layers != (XrCompositionLayerBaseHeader **)0x0)) {
        if (value->layers != (XrCompositionLayerBaseHeader **)0x0) {
          for (local_478 = 0; local_478 < value->layerCount; local_478 = local_478 + 1) {
            if (value->layers[local_478] == (XrCompositionLayerBaseHeader *)0x0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_498,"Structure XrFrameEndInfo member layers",&local_499);
              std::allocator<char>::~allocator((allocator<char> *)&local_499);
              std::__cxx11::string::operator+=(local_498,"[");
              std::__cxx11::to_string(local_4c0,local_478);
              std::__cxx11::string::operator+=(local_498,(string *)local_4c0);
              std::__cxx11::string::~string((string *)local_4c0);
              std::__cxx11::string::operator+=(local_498,"]");
              std::__cxx11::string::operator+=(local_498," is null");
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_4e0,"VUID-XrFrameEndInfo-layers-parameter",&local_4e1);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&new_compositionlayerprojection_value,objects_info);
              CoreValidLogMessage(instance_info,(string *)local_4e0,VALID_USAGE_DEBUG_SEVERITY_ERROR
                                  ,command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&new_compositionlayerprojection_value,(string *)local_498);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                       *)&new_compositionlayerprojection_value);
              std::__cxx11::string::~string(local_4e0);
              std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
              std::__cxx11::string::~string(local_498);
              return XR_ERROR_VALIDATION_FAILURE;
            }
            if (((value->layers == (XrCompositionLayerBaseHeader **)0x0) ||
                (ppXVar1 = value->layers,
                ppXVar1[local_478]->type != XR_TYPE_COMPOSITION_LAYER_PROJECTION)) ||
               (ppXVar1 == (XrCompositionLayerBaseHeader **)0x0)) {
              if (((value->layers == (XrCompositionLayerBaseHeader **)0x0) ||
                  (ppXVar1 = value->layers,
                  ppXVar1[local_478]->type != XR_TYPE_COMPOSITION_LAYER_QUAD)) ||
                 (ppXVar1 == (XrCompositionLayerBaseHeader **)0x0)) {
                if (((value->layers == (XrCompositionLayerBaseHeader **)0x0) ||
                    (ppXVar1 = value->layers,
                    ppXVar1[local_478]->type != XR_TYPE_COMPOSITION_LAYER_CUBE_KHR)) ||
                   (ppXVar1 == (XrCompositionLayerBaseHeader **)0x0)) {
                  if (((value->layers == (XrCompositionLayerBaseHeader **)0x0) ||
                      (ppXVar1 = value->layers,
                      ppXVar1[local_478]->type != XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR)) ||
                     (ppXVar1 == (XrCompositionLayerBaseHeader **)0x0)) {
                    if (((value->layers == (XrCompositionLayerBaseHeader **)0x0) ||
                        (ppXVar1 = value->layers,
                        ppXVar1[local_478]->type != XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR)) ||
                       (ppXVar1 == (XrCompositionLayerBaseHeader **)0x0)) {
                      if (((value->layers == (XrCompositionLayerBaseHeader **)0x0) ||
                          (ppXVar1 = value->layers,
                          ppXVar1[local_478]->type != XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR)) ||
                         (ppXVar1 == (XrCompositionLayerBaseHeader **)0x0)) {
                        if (((value->layers == (XrCompositionLayerBaseHeader **)0x0) ||
                            (ppXVar1 = value->layers,
                            ppXVar1[local_478]->type != XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB))
                           || (ppXVar1 == (XrCompositionLayerBaseHeader **)0x0)) {
                          if (((value->layers == (XrCompositionLayerBaseHeader **)0x0) ||
                              (ppXVar1 = value->layers,
                              ppXVar1[local_478]->type != XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC)
                              ) || (ppXVar1 == (XrCompositionLayerBaseHeader **)0x0)) {
                            if ((value->layers[local_478] != (XrCompositionLayerBaseHeader *)0x0) &&
                               (valid_ext_structs.
                                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                                     ValidateXrStruct(instance_info,command_name,objects_info,
                                                      check_members,true,value->layers[local_478]),
                               valid_ext_structs.
                               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ !=
                               XR_SUCCESS)) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_9a0,"VUID-XrFrameEndInfo-layers-parameter",&local_9a1
                                        );
                              std::
                              vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ::vector(&local_9c0,objects_info);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_9e0,
                                         "Structure XrFrameEndInfo member layers is invalid",
                                         &local_9e1);
                              CoreValidLogMessage(instance_info,(string *)local_9a0,
                                                  VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                                  &local_9c0,(string *)local_9e0);
                              std::__cxx11::string::~string(local_9e0);
                              std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
                              std::
                              vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ::~vector(&local_9c0);
                              std::__cxx11::string::~string(local_9a0);
                              std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
                              return valid_ext_structs.
                                     super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                            }
                          }
                          else {
                            XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,
                                                     check_members,true,
                                                     (XrCompositionLayerPassthroughHTC *)
                                                     ppXVar1[local_478]);
                            if (XVar3 != XR_SUCCESS) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_918,"Structure XrFrameEndInfo member layers",
                                         &local_919);
                              std::allocator<char>::~allocator((allocator<char> *)&local_919);
                              std::__cxx11::string::operator+=(local_918,"[");
                              std::__cxx11::to_string(local_940,local_478);
                              std::__cxx11::string::operator+=(local_918,(string *)local_940);
                              std::__cxx11::string::~string((string *)local_940);
                              std::__cxx11::string::operator+=(local_918,"]");
                              std::__cxx11::string::operator+=(local_918," is invalid");
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_960,"VUID-XrFrameEndInfo-layers-parameter",&local_961
                                        );
                              std::
                              vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ::vector(&local_980,objects_info);
                              CoreValidLogMessage(instance_info,(string *)local_960,
                                                  VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                                  &local_980,(string *)local_918);
                              std::
                              vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ::~vector(&local_980);
                              std::__cxx11::string::~string(local_960);
                              std::allocator<char>::~allocator((allocator<char> *)&local_961);
                              std::__cxx11::string::~string(local_918);
                              return XR_ERROR_VALIDATION_FAILURE;
                            }
                            valid_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
                          }
                        }
                        else {
                          XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,
                                                   check_members,true,
                                                   (XrCompositionLayerPassthroughFB *)
                                                   ppXVar1[local_478]);
                          if (XVar3 != XR_SUCCESS) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      (local_888,"Structure XrFrameEndInfo member layers",&local_889
                                      );
                            std::allocator<char>::~allocator((allocator<char> *)&local_889);
                            std::__cxx11::string::operator+=(local_888,"[");
                            std::__cxx11::to_string(local_8b0,local_478);
                            std::__cxx11::string::operator+=(local_888,(string *)local_8b0);
                            std::__cxx11::string::~string((string *)local_8b0);
                            std::__cxx11::string::operator+=(local_888,"]");
                            std::__cxx11::string::operator+=(local_888," is invalid");
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      (local_8d0,"VUID-XrFrameEndInfo-layers-parameter",&local_8d1);
                            std::
                            vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      *)&new_compositionlayerpassthroughhtc_value,objects_info);
                            CoreValidLogMessage(instance_info,(string *)local_8d0,
                                                VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                                 *)&new_compositionlayerpassthroughhtc_value,
                                                (string *)local_888);
                            std::
                            vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                       *)&new_compositionlayerpassthroughhtc_value);
                            std::__cxx11::string::~string(local_8d0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
                            std::__cxx11::string::~string(local_888);
                            return XR_ERROR_VALIDATION_FAILURE;
                          }
                          valid_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
                        }
                      }
                      else {
                        XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,
                                                 check_members,true,
                                                 (XrCompositionLayerEquirect2KHR *)
                                                 ppXVar1[local_478]);
                        if (XVar3 != XR_SUCCESS) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    (local_7f8,"Structure XrFrameEndInfo member layers",&local_7f9);
                          std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
                          std::__cxx11::string::operator+=(local_7f8,"[");
                          std::__cxx11::to_string(local_820,local_478);
                          std::__cxx11::string::operator+=(local_7f8,(string *)local_820);
                          std::__cxx11::string::~string((string *)local_820);
                          std::__cxx11::string::operator+=(local_7f8,"]");
                          std::__cxx11::string::operator+=(local_7f8," is invalid");
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    (local_840,"VUID-XrFrameEndInfo-layers-parameter",&local_841);
                          std::
                          vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    *)&new_compositionlayerpassthroughfb_value,objects_info);
                          CoreValidLogMessage(instance_info,(string *)local_840,
                                              VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                               *)&new_compositionlayerpassthroughfb_value,
                                              (string *)local_7f8);
                          std::
                          vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                     *)&new_compositionlayerpassthroughfb_value);
                          std::__cxx11::string::~string(local_840);
                          std::allocator<char>::~allocator((allocator<char> *)&local_841);
                          std::__cxx11::string::~string(local_7f8);
                          return XR_ERROR_VALIDATION_FAILURE;
                        }
                        valid_ext_structs.
                        super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
                      }
                    }
                    else {
                      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,check_members
                                               ,true,(XrCompositionLayerEquirectKHR *)
                                                     ppXVar1[local_478]);
                      if (XVar3 != XR_SUCCESS) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  (local_768,"Structure XrFrameEndInfo member layers",&local_769);
                        std::allocator<char>::~allocator((allocator<char> *)&local_769);
                        std::__cxx11::string::operator+=(local_768,"[");
                        std::__cxx11::to_string(local_790,local_478);
                        std::__cxx11::string::operator+=(local_768,(string *)local_790);
                        std::__cxx11::string::~string((string *)local_790);
                        std::__cxx11::string::operator+=(local_768,"]");
                        std::__cxx11::string::operator+=(local_768," is invalid");
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  (local_7b0,"VUID-XrFrameEndInfo-layers-parameter",&local_7b1);
                        std::
                        vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  *)&new_compositionlayerequirect2khr_value,objects_info);
                        CoreValidLogMessage(instance_info,(string *)local_7b0,
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                             *)&new_compositionlayerequirect2khr_value,
                                            (string *)local_768);
                        std::
                        vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&new_compositionlayerequirect2khr_value);
                        std::__cxx11::string::~string(local_7b0);
                        std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
                        std::__cxx11::string::~string(local_768);
                        return XR_ERROR_VALIDATION_FAILURE;
                      }
                      valid_ext_structs.
                      super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
                    }
                  }
                  else {
                    XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,
                                             true,(XrCompositionLayerCylinderKHR *)
                                                  ppXVar1[local_478]);
                    if (XVar3 != XR_SUCCESS) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_6d8,"Structure XrFrameEndInfo member layers",&local_6d9);
                      std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
                      std::__cxx11::string::operator+=(local_6d8,"[");
                      std::__cxx11::to_string(local_700,local_478);
                      std::__cxx11::string::operator+=(local_6d8,(string *)local_700);
                      std::__cxx11::string::~string((string *)local_700);
                      std::__cxx11::string::operator+=(local_6d8,"]");
                      std::__cxx11::string::operator+=(local_6d8," is invalid");
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_720,"VUID-XrFrameEndInfo-layers-parameter",&local_721);
                      std::
                      vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                *)&new_compositionlayerequirectkhr_value,objects_info);
                      CoreValidLogMessage(instance_info,(string *)local_720,
                                          VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                           *)&new_compositionlayerequirectkhr_value,
                                          (string *)local_6d8);
                      std::
                      vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)&new_compositionlayerequirectkhr_value);
                      std::__cxx11::string::~string(local_720);
                      std::allocator<char>::~allocator((allocator<char> *)&local_721);
                      std::__cxx11::string::~string(local_6d8);
                      return XR_ERROR_VALIDATION_FAILURE;
                    }
                    valid_ext_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
                  }
                }
                else {
                  XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,
                                           true,(XrCompositionLayerCubeKHR *)ppXVar1[local_478]);
                  if (XVar3 != XR_SUCCESS) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_648,"Structure XrFrameEndInfo member layers",&local_649);
                    std::allocator<char>::~allocator((allocator<char> *)&local_649);
                    std::__cxx11::string::operator+=(local_648,"[");
                    std::__cxx11::to_string(local_670,local_478);
                    std::__cxx11::string::operator+=(local_648,(string *)local_670);
                    std::__cxx11::string::~string((string *)local_670);
                    std::__cxx11::string::operator+=(local_648,"]");
                    std::__cxx11::string::operator+=(local_648," is invalid");
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_690,"VUID-XrFrameEndInfo-layers-parameter",&local_691);
                    std::
                    vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                    vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&new_compositionlayercylinderkhr_value,objects_info);
                    CoreValidLogMessage(instance_info,(string *)local_690,
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                         *)&new_compositionlayercylinderkhr_value,
                                        (string *)local_648);
                    std::
                    vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                    ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&new_compositionlayercylinderkhr_value);
                    std::__cxx11::string::~string(local_690);
                    std::allocator<char>::~allocator((allocator<char> *)&local_691);
                    std::__cxx11::string::~string(local_648);
                    return XR_ERROR_VALIDATION_FAILURE;
                  }
                  valid_ext_structs.
                  super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
                }
              }
              else {
                XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                         (XrCompositionLayerQuad *)ppXVar1[local_478]);
                if (XVar3 != XR_SUCCESS) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_5b8,"Structure XrFrameEndInfo member layers",&local_5b9);
                  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
                  std::__cxx11::string::operator+=(local_5b8,"[");
                  std::__cxx11::to_string(local_5e0,local_478);
                  std::__cxx11::string::operator+=(local_5b8,(string *)local_5e0);
                  std::__cxx11::string::~string((string *)local_5e0);
                  std::__cxx11::string::operator+=(local_5b8,"]");
                  std::__cxx11::string::operator+=(local_5b8," is invalid");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_600,"VUID-XrFrameEndInfo-layers-parameter",&local_601);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&new_compositionlayercubekhr_value,objects_info);
                  CoreValidLogMessage(instance_info,(string *)local_600,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                       *)&new_compositionlayercubekhr_value,(string *)local_5b8);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&new_compositionlayercubekhr_value);
                  std::__cxx11::string::~string(local_600);
                  std::allocator<char>::~allocator((allocator<char> *)&local_601);
                  std::__cxx11::string::~string(local_5b8);
                  return XR_ERROR_VALIDATION_FAILURE;
                }
                valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
              }
            }
            else {
              XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                       (XrCompositionLayerProjection *)ppXVar1[local_478]);
              if (XVar3 != XR_SUCCESS) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_528,"Structure XrFrameEndInfo member layers",&local_529);
                std::allocator<char>::~allocator((allocator<char> *)&local_529);
                std::__cxx11::string::operator+=(local_528,"[");
                std::__cxx11::to_string(local_550,local_478);
                std::__cxx11::string::operator+=(local_528,(string *)local_550);
                std::__cxx11::string::~string((string *)local_550);
                std::__cxx11::string::operator+=(local_528,"]");
                std::__cxx11::string::operator+=(local_528," is invalid");
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_570,"VUID-XrFrameEndInfo-layers-parameter",&local_571);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        *)&new_compositionlayerquad_value,objects_info);
                CoreValidLogMessage(instance_info,(string *)local_570,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                    (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                     *)&new_compositionlayerquad_value,(string *)local_528);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&new_compositionlayerquad_value);
                std::__cxx11::string::~string(local_570);
                std::allocator<char>::~allocator((allocator<char> *)&local_571);
                std::__cxx11::string::~string(local_528);
                return XR_ERROR_VALIDATION_FAILURE;
              }
              valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
            }
          }
        }
        instance_info_local._4_4_ =
             valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_430,"VUID-XrFrameEndInfo-layers-parameter",&local_431);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_450,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&value_layers_inc,
                   "Structure XrFrameEndInfo member layerCount is NULL, but value->layerCount is greater than 0"
                   ,&local_471);
        CoreValidLogMessage(instance_info,(string *)local_430,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_450,(string *)&value_layers_inc);
        std::__cxx11::string::~string((string *)&value_layers_inc);
        std::allocator<char>::~allocator((allocator<char> *)&local_471);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_450);
        std::__cxx11::string::~string(local_430);
        std::allocator<char>::~allocator((allocator<char> *)&local_431);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_390);
      std::operator<<((ostream *)local_390,
                      "XrFrameEndInfo contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_3b0);
      std::operator<<((ostream *)local_390,local_3b0);
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3d0,"VUID-XrFrameEndInfo-environmentBlendMode-parameter",&local_3d1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_3f0,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_3d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_3f0,local_410);
      std::__cxx11::string::~string((string *)local_410);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_3f0);
      std::__cxx11::string::~string(local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_390);
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFrameEndInfo* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_FRAME_END_INFO) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrFrameEndInfo",
                             value->type, "VUID-XrFrameEndInfo-type-type", XR_TYPE_FRAME_END_INFO, "XR_TYPE_FRAME_END_INFO");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_FRAME_END_INFO_ML);
        valid_ext_structs.push_back(XR_TYPE_GLOBAL_DIMMER_FRAME_END_INFO_ML);
        valid_ext_structs.push_back(XR_TYPE_LOCAL_DIMMING_FRAME_END_INFO_META);
        valid_ext_structs.push_back(XR_TYPE_SECONDARY_VIEW_CONFIGURATION_FRAME_END_INFO_MSFT);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrFrameEndInfo struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrFrameEndInfo : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrFrameEndInfo struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrEnvironmentBlendMode value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFrameEndInfo", "environmentBlendMode", objects_info, value->environmentBlendMode)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFrameEndInfo contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->environmentBlendMode));
        CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-environmentBlendMode-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Optional array must be non-NULL when value->layerCount is non-zero
    if (0 != value->layerCount && nullptr == value->layers) {
        CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrFrameEndInfo member layerCount is NULL, but value->layerCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->layers) {
        for (uint32_t value_layers_inc = 0; value_layers_inc < value->layerCount; ++value_layers_inc) {
            if (value->layers[value_layers_inc] == nullptr) {
                std::string error_message = "Structure XrFrameEndInfo member layers";
                error_message += "[";
                error_message += std::to_string(value_layers_inc);
                error_message += "]";
                error_message += " is null";
                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerProjection and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerProjection* const* new_compositionlayerprojection_value = reinterpret_cast<const XrCompositionLayerProjection* const*>(value->layers);
                    if (new_compositionlayerprojection_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
                        if (nullptr != new_compositionlayerprojection_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerprojection_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerQuad and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerQuad* const* new_compositionlayerquad_value = reinterpret_cast<const XrCompositionLayerQuad* const*>(value->layers);
                    if (new_compositionlayerquad_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
                        if (nullptr != new_compositionlayerquad_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerquad_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCubeKHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerCubeKHR* const* new_compositionlayercubekhr_value = reinterpret_cast<const XrCompositionLayerCubeKHR* const*>(value->layers);
                    if (new_compositionlayercubekhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
                        if (nullptr != new_compositionlayercubekhr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayercubekhr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCylinderKHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerCylinderKHR* const* new_compositionlayercylinderkhr_value = reinterpret_cast<const XrCompositionLayerCylinderKHR* const*>(value->layers);
                    if (new_compositionlayercylinderkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
                        if (nullptr != new_compositionlayercylinderkhr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayercylinderkhr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirectKHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerEquirectKHR* const* new_compositionlayerequirectkhr_value = reinterpret_cast<const XrCompositionLayerEquirectKHR* const*>(value->layers);
                    if (new_compositionlayerequirectkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
                        if (nullptr != new_compositionlayerequirectkhr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerequirectkhr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirect2KHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerEquirect2KHR* const* new_compositionlayerequirect2khr_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR* const*>(value->layers);
                    if (new_compositionlayerequirect2khr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
                        if (nullptr != new_compositionlayerequirect2khr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerequirect2khr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughFB and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerPassthroughFB* const* new_compositionlayerpassthroughfb_value = reinterpret_cast<const XrCompositionLayerPassthroughFB* const*>(value->layers);
                    if (new_compositionlayerpassthroughfb_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
                        if (nullptr != new_compositionlayerpassthroughfb_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerpassthroughfb_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughHTC and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerPassthroughHTC* const* new_compositionlayerpassthroughhtc_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC* const*>(value->layers);
                    if (new_compositionlayerpassthroughhtc_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
                        if (nullptr != new_compositionlayerpassthroughhtc_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerpassthroughhtc_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate that the base-structure XrCompositionLayerBaseHeader is valid
            if (nullptr != value->layers[value_layers_inc]) {
                xr_result = ValidateXrStruct(instance_info, command_name,
                                                                objects_info, check_members, true, value->layers[value_layers_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                        objects_info,
                                        "Structure XrFrameEndInfo member layers is invalid");
                    return xr_result;
                }
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}